

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomElement __thiscall
QDomNode::previousSiblingElement(QDomNode *this,QString *tagName,QString *namespaceURI)

{
  QAtomicInt *pQVar1;
  Data *pDVar2;
  QDomNodePrivate *pQVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  long in_RCX;
  QArrayData *unaff_RBP;
  storage_type_conflict *psVar9;
  char16_t *pcVar10;
  long lVar11;
  qsizetype qVar12;
  QArrayData *unaff_R13;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QDomNode sib;
  QDomNode local_48;
  QDomNode local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (tagName->d).d;
  if (pDVar2 == (Data *)0x0) {
    QDomNode(&local_40);
  }
  else {
    QDomNode(&local_40,*(QDomNodePrivate **)&pDVar2[1].super_QArrayData);
  }
  do {
    bVar6 = (QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0;
    if (bVar6) {
      QDomDocument::~QDomDocument((QDomDocument *)&local_40);
LAB_0011022b:
      QDomElement::QDomElement((QDomElement *)this);
LAB_00110233:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QDomElement)(QDomNode)this;
    }
    iVar8 = (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->_vptr_QDomNodePrivate
              [0xb])();
    if (iVar8 == 1) {
      if (*(long *)(in_RCX + 0x10) == 0) {
        bVar5 = true;
        cVar7 = '\x01';
      }
      else {
        if ((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) {
          unaff_RBP = (QArrayData *)0x0;
          psVar9 = (storage_type_conflict *)0x0;
          lVar11 = 0;
        }
        else {
          unaff_RBP = &(((local_40.impl)->namespaceURI).d.d)->super_QArrayData;
          psVar9 = ((local_40.impl)->namespaceURI).d.ptr;
          lVar11 = ((local_40.impl)->namespaceURI).d.size;
          if (unaff_RBP != (QArrayData *)0x0) {
            LOCK();
            (unaff_RBP->ref_)._q_value.super___atomic_base<int>._M_i =
                 (unaff_RBP->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        if (lVar11 != *(long *)(in_RCX + 0x10)) {
          bVar5 = false;
          goto LAB_00110099;
        }
        QVar13.m_data = psVar9;
        QVar13.m_size = lVar11;
        QVar15.m_data = *(storage_type_conflict **)(in_RCX + 8);
        QVar15.m_size = *(long *)(in_RCX + 0x10);
        cVar7 = QtPrivate::equalStrings(QVar13,QVar15);
        bVar5 = false;
      }
    }
    else {
      bVar5 = true;
LAB_00110099:
      cVar7 = '\0';
    }
    if ((!bVar5) && (unaff_RBP != (QArrayData *)0x0)) {
      LOCK();
      (unaff_RBP->ref_)._q_value.super___atomic_base<int>._M_i =
           (unaff_RBP->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((unaff_RBP->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(unaff_RBP,2,0x10);
      }
    }
    if (cVar7 != '\0') {
      this->impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      if (((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) ||
         (iVar8 = (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->
                    _vptr_QDomNodePrivate[0xb])(), iVar8 != 1)) {
        QDomElement::QDomElement((QDomElement *)this);
      }
      else {
        QDomElement::QDomElement((QDomElement *)this,(QDomElementPrivate *)local_40.impl);
      }
      lVar11 = (namespaceURI->d).size;
      if (lVar11 == 0) {
        cVar7 = '\x01';
      }
      else {
        pQVar3 = this->impl;
        if (pQVar3 == (QDomNodePrivate *)0x0) {
          unaff_R13 = (QArrayData *)0x0;
          pcVar10 = (char16_t *)0x0;
          qVar12 = 0;
        }
        else {
          unaff_R13 = &((pQVar3->name).d.d)->super_QArrayData;
          pcVar10 = (pQVar3->name).d.ptr;
          qVar12 = (pQVar3->name).d.size;
          if (unaff_R13 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&unaff_R13->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&unaff_R13->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
        }
        lVar4 = (namespaceURI->d).size;
        if (qVar12 == lVar4) {
          QVar14.m_data = pcVar10;
          QVar14.m_size = qVar12;
          QVar16.m_data = (namespaceURI->d).ptr;
          QVar16.m_size = lVar4;
          cVar7 = QtPrivate::equalStrings(QVar14,QVar16);
        }
        else {
          cVar7 = '\0';
        }
      }
      if ((lVar11 != 0) && (unaff_R13 != (QArrayData *)0x0)) {
        LOCK();
        (unaff_R13->ref_)._q_value.super___atomic_base<int>._M_i =
             (unaff_R13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((unaff_R13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(unaff_R13,2,0x10);
        }
      }
      if (cVar7 != '\0') {
        QDomDocument::~QDomDocument((QDomDocument *)&local_40);
        if (!bVar6) goto LAB_00110233;
        goto LAB_0011022b;
      }
      if (this->impl != (QDomNodePrivate *)0x0) {
        LOCK();
        pQVar1 = &this->impl->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (this->impl != (QDomNodePrivate *)0x0)) {
          (*this->impl->_vptr_QDomNodePrivate[1])();
        }
      }
    }
    if ((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) {
      QDomNode(&local_48);
    }
    else {
      QDomNode(&local_48,(local_40.impl)->prev);
    }
    if ((QDomElementPrivate *)local_48.impl != (QDomElementPrivate *)0x0) {
      LOCK();
      ((local_48.impl)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           ((local_48.impl)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QDomElementPrivate *)local_40.impl != (QDomElementPrivate *)0x0) {
      LOCK();
      pQVar1 = &(local_40.impl)->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         ((QDomElementPrivate *)local_40.impl != (QDomElementPrivate *)0x0)) {
        (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->_vptr_QDomNodePrivate[1])();
      }
    }
    local_40.impl = local_48.impl;
    QDomDocument::~QDomDocument((QDomDocument *)&local_48);
  } while( true );
}

Assistant:

QDomElement QDomNode::previousSiblingElement(const QString &tagName, const QString &namespaceURI) const
{
    for (QDomNode sib = previousSibling(); !sib.isNull(); sib = sib.previousSibling()) {
        if (sib.isElement() && (namespaceURI.isEmpty() || sib.namespaceURI() == namespaceURI)) {
            QDomElement elt = sib.toElement();
            if (tagName.isEmpty() || elt.tagName() == tagName)
                return elt;
        }
    }
    return QDomElement();
}